

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_connect(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  SASL *sasl;
  short sVar2;
  connectdata *conn;
  int iVar3;
  CURLcode CVar4;
  char cVar5;
  char *first;
  char *pcVar6;
  byte bVar7;
  size_t len;
  bool bVar8;
  char *value;
  bool bVar9;
  
  conn = data->conn;
  *done = false;
  bVar8 = false;
  Curl_conncontrol(conn,0);
  (conn->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn->proto).ftpc.pp.statemachine = imap_statemachine;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).imapc.preftype = '\x03';
  sasl = &(conn->proto).imapc.sasl;
  Curl_sasl_init(sasl,data,&saslimap);
  Curl_dyn_init(&(conn->proto).imapc.dyn,0x10000);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  CVar4 = CURLE_OK;
  while( true ) {
    bVar9 = CVar4 == CURLE_OK;
    if ((!bVar9) || (first == (char *)0x0)) goto LAB_0013924a;
    cVar5 = *first;
    pcVar6 = first;
    if (cVar5 == '\0') break;
    while ((value = pcVar6 + 1, cVar5 != '\0' && (cVar5 != '='))) {
      pcVar6 = value;
      cVar5 = *value;
    }
    len = 0xffffffffffffffff;
    while ((cVar5 != '\0' && (cVar5 != ';'))) {
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      len = len + 1;
      cVar5 = *pcVar1;
    }
    iVar3 = curl_strnequal(first,"AUTH=+LOGIN",0xb);
    bVar8 = iVar3 != 0;
    if (iVar3 == 0) {
      iVar3 = curl_strnequal(first,"AUTH=",5);
      CVar4 = CURLE_URL_MALFORMAT;
      if (iVar3 != 0) {
        CVar4 = Curl_sasl_parse_url_auth_option(sasl,value,len);
      }
    }
    else {
      *(undefined2 *)((long)&conn->proto + 0xba) = 0;
      CVar4 = CURLE_OK;
    }
    first = pcVar6 + (*pcVar6 == ';');
  }
  bVar9 = true;
LAB_0013924a:
  bVar7 = 1;
  if ((!bVar8) &&
     (sVar2 = *(short *)((long)&conn->proto + 0xba), bVar7 = sVar2 == -0x21 | 2, sVar2 == 0)) {
    bVar7 = 0;
  }
  (conn->proto).imapc.preftype = bVar7;
  if (!bVar9) {
    return CVar4;
  }
  (data->conn->proto).imapc.state = IMAP_SERVERGREET;
  *(undefined2 *)((long)&conn->proto + 0xf4) = 0x2a;
  CVar4 = imap_multi_statemach(data,done);
  return CVar4;
}

Assistant:

static CURLcode imap_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  PINGPONG_SETUP(pp, imap_statemachine, imap_endofresp);

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, data, &saslimap);

  Curl_dyn_init(&imapc->dyn, DYN_IMAP_CMD);
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  imap_state(data, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(data, done);

  return result;
}